

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool openjtalk_setVoiceSjis(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  char *in_RSI;
  long in_RDI;
  char *res;
  char temp [260];
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (in_RSI == (char *)0x0) {
    *(undefined4 *)(in_RDI + 0x678) = 0xc;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RSI != (char *)0x0) && (sVar2 = strlen(in_RSI), sVar2 != 0)) {
      pcVar3 = sjistou8_path(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (pcVar3 == (char *)0x0) {
        return false;
      }
      _Var1 = set_voice((OpenJTalk *)temp._248_8_,(char *)temp._240_8_);
      return _Var1;
    }
    *(undefined4 *)(in_RDI + 0x678) = 0xb;
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setVoiceSjis(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlen(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}

	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = sjistou8_path(path, temp);
#else
	char *res = sjistou8_path(path, temp);
#endif
	if (!res)
	{
		return false;
	}
	return set_voice(oj, temp);
}